

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O1

void duckdb::BaseModeFunction<duckdb::ModeString>::
     Execute<duckdb::string_t,duckdb::ModeState<duckdb::string_t,duckdb::ModeString>,duckdb::ModeFallbackFunction<duckdb::ModeString>>
               (ModeState<duckdb::string_t,_duckdb::ModeString> *state,string_t *key,
               AggregateInputData *input_data)

{
  ArenaAllocator *pAVar1;
  ulong uVar2;
  Counts *pCVar3;
  mapped_type *pmVar4;
  ulong uVar5;
  
  if (state->frequency_map == (Counts *)0x0) {
    pAVar1 = input_data->allocator;
    pCVar3 = (Counts *)operator_new(0x48);
    pCVar3->allocator = (Allocator *)(pAVar1 + 0x20);
    (pCVar3->map)._M_h._M_buckets = &(pCVar3->map)._M_h._M_single_bucket;
    (pCVar3->map)._M_h._M_bucket_count = 1;
    (pCVar3->map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (pCVar3->map)._M_h._M_element_count = 0;
    (pCVar3->map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    (pCVar3->map)._M_h._M_rehash_policy._M_next_resize = 0;
    (pCVar3->map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
    pCVar3->free_type = DOES_NOT_REQUIRE_FREE;
    state->frequency_map = pCVar3;
  }
  pmVar4 = OwningStringMap<duckdb::ModeAttr,_std::unordered_map<duckdb::string_t,_duckdb::ModeAttr,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>_>_>_>
           ::GetOrCreate(state->frequency_map,(key_type)(key->value).pointer);
  pmVar4->count = pmVar4->count + 1;
  uVar2 = state->count;
  uVar5 = pmVar4->first_row;
  if (uVar2 <= pmVar4->first_row) {
    uVar5 = uVar2;
  }
  pmVar4->first_row = uVar5;
  state->count = uVar2 + 1;
  return;
}

Assistant:

static void Execute(STATE &state, const INPUT_TYPE &key, AggregateInputData &input_data) {
		if (!state.frequency_map) {
			state.frequency_map = TYPE_OP::CreateEmpty(input_data.allocator);
		}
		auto &i = (*state.frequency_map)[key];
		++i.count;
		i.first_row = MinValue<idx_t>(i.first_row, state.count);
		++state.count;
	}